

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

int cvui::internal::input
              (cvui_block_t *theBlock,int theX,int theY,int theWidth,String *theName,
              String *theContent,double theFontScale,bool theUpdateLayout)

{
  bool theFocused;
  int iVar1;
  int iVar2;
  int iVar3;
  Size aTextSize;
  Rect aRect;
  Size aContentSize;
  Size local_58;
  Size local_50;
  Rect local_48;
  string local_38 [4];
  int local_34;
  
  cv::getTextSize(local_38,(int)theContent,theFontScale,0,(int *)0x1);
  iVar3 = theWidth - (int)(theFontScale * 16.0);
  iVar2 = local_34 + (local_34 - (local_34 >> 0x1f) & 0xfffffffeU) + 2;
  local_48.x = theX;
  local_48.y = theY;
  local_48.width = iVar3;
  local_48.height = iVar2;
  theFocused = inputUpdateFocus(theX,theY,theName,&local_48);
  iVar3 = iarea(theX,theY,iVar3,iVar2);
  iVar1 = inputUpdateCursor(theWidth,theContent,theFontScale,theFocused);
  iVar2 = DAT_001247c4 + 1;
  if (0x13 < DAT_001247c4) {
    iVar2 = 0;
  }
  DAT_001247c4 = iVar2;
  if (theUpdateLayout) {
    cv::getTextSize((string *)&local_50,(int)theContent,theFontScale,0,(int *)0x1);
    local_58 = local_50;
    updateLayoutFlow(theBlock,&local_58);
  }
  render::input(theBlock,&local_48,theContent,theFontScale,iVar3,theFocused);
  return iVar1;
}

Assistant:

int input(cvui_block_t& theBlock, int theX, int theY, int theWidth, const cv::String theName, cv::String& theContent, double theFontScale, bool theUpdateLayout) {
		cv::Size aContentSize = cv::getTextSize(theContent, cv::FONT_HERSHEY_SIMPLEX, theFontScale, 1, nullptr);
		int aPadding = aContentSize.height / 2;
        cv::Rect aRect(theX, theY, theWidth - render::getScreenCharWidth(theFontScale), aContentSize.height + 2 + aPadding * 2);

        bool aFocused = inputUpdateFocus(theX, theY, theName, aRect);
        int aInputAreaInteraction = cvui::iarea(theX, theY, aRect.width, aRect.height);        

        int key = inputUpdateCursor(theWidth, theContent, theFontScale, aFocused);
        inputUpdateCursorBlink();

		// Update the layout flow according to input size if we were told to update.
		if (theUpdateLayout) {
            cv::Size aTextSize = cv::getTextSize(theContent, cv::FONT_HERSHEY_SIMPLEX, theFontScale, 1, nullptr);
			cv::Size aSize(theWidth, aTextSize.height + aPadding * 2);
			updateLayoutFlow(theBlock, aTextSize);
		}

        render::input(theBlock, aRect, theContent, theFontScale, aInputAreaInteraction, aFocused);

        return key;
	}